

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

Level * __thiscall hta::Metric::get_level(Metric *this,Duration interval)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>
  _Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_bool>
  pVar4;
  key_type local_50;
  Level local_48;
  
  p_Var3 = (_Base_ptr)(this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->levels_)._M_t._M_impl.super__Rb_tree_header;
    _Var2._M_node = (_Base_ptr)p_Var1;
    do {
      if (interval.__r <= *(long *)(p_Var3 + 1)) {
        _Var2._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < interval.__r];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var2._M_node != p_Var1) &&
       (*(long *)(_Var2._M_node + 1) <= interval.__r)) goto LAB_0016541b;
  }
  local_50.__r = interval.__r;
  restore_level(&local_48,this,interval);
  pVar4 = std::
          map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
          ::try_emplace<hta::Level>(&this->levels_,&local_50,&local_48);
  _Var2 = pVar4.first._M_node;
LAB_0016541b:
  return (Level *)&_Var2._M_node[1]._M_parent;
}

Assistant:

Level& Metric::get_level(Duration interval)
{
    auto it = levels_.find(interval);
    if (it == levels_.end())
    {
        bool added;
        std::tie(it, added) = levels_.try_emplace(interval, restore_level(interval));
    }
    return it->second;
}